

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeCache.cxx
# Opt level: O2

bool __thiscall cmFileTimeCache::Compare(cmFileTimeCache *this,string *f1,string *f2,int *result)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  cmFileTime ft2;
  cmFileTime ft1;
  cmFileTime local_28;
  cmFileTime local_20;
  
  local_20.Time = 0;
  local_28.Time = 0;
  bVar1 = Load(this,f1,&local_20);
  iVar3 = 0;
  bVar2 = false;
  if (bVar1) {
    bVar1 = Load(this,f2,&local_28);
    iVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      iVar3 = ((local_28.Time <= local_20.Time) - 1) + (uint)(local_28.Time <= local_20.Time);
      if (local_20.Time == local_28.Time) {
        iVar3 = 0;
      }
      bVar2 = true;
    }
  }
  *result = iVar3;
  return bVar2;
}

Assistant:

bool cmFileTimeCache::Compare(std::string const& f1, std::string const& f2,
                              int* result)
{
  // Get the modification time for each file.
  cmFileTime ft1;
  cmFileTime ft2;
  if (this->Load(f1, ft1) && this->Load(f2, ft2)) {
    // Compare the two modification times.
    *result = ft1.Compare(ft2);
    return true;
  }
  // No comparison available.  Default to the same time.
  *result = 0;
  return false;
}